

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h263d_parser.c
# Opt level: O2

MPP_RET mpp_h263_parser_split(H263dParser ctx,MppPacket dst,MppPacket src)

{
  ushort uVar1;
  RK_U32 RVar2;
  uint uVar3;
  void *pvVar4;
  size_t sVar5;
  void *__src;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  MPP_RET MVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  size_t __n;
  
  pvVar4 = mpp_packet_get_data(dst);
  sVar5 = mpp_packet_get_length(dst);
  __src = mpp_packet_get_pos(src);
  sVar6 = mpp_packet_get_length(src);
  uVar12 = *(uint *)((long)ctx + 0x28);
  uVar13 = *(uint *)((long)ctx + 0x2c);
  RVar2 = mpp_packet_get_eos(src);
  if (((byte)h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"in\n","mpp_h263_parser_split");
  }
  uVar14 = (uint)sVar6;
  if (uVar14 == 0) {
    _mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"src_len",
               "mpp_h263_parser_split",0x147);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0018391e;
  }
  if (sVar5 == 0) {
    uVar3 = 0xffffffff;
  }
  else {
    if (sVar5 < 4) {
      _mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"dst_len >= 4",
                 "mpp_h263_parser_split",0x14a);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0018391e;
    }
    uVar1 = *(ushort *)((long)pvVar4 + (sVar5 - 2));
    uVar3 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
  }
  iVar7 = 0;
  if ((int)uVar12 < 0) {
    uVar10 = 0;
    uVar8 = 0;
    if (0 < (int)uVar14) {
      uVar8 = sVar6 & 0xffffffff;
    }
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      uVar3 = uVar3 << 8 | (uint)*(byte *)((long)__src + uVar10);
      if (((*(byte *)((long)__src + uVar10) & 0x7c) == 0) && ((uVar3 & 0xffff80) == 0x80)) {
        uVar12 = (int)uVar10 - 2;
        uVar8 = (ulong)((int)uVar10 + 1);
        break;
      }
    }
    iVar7 = (int)uVar8;
    if (-1 < (int)uVar12) goto LAB_001837b7;
  }
  else {
LAB_001837b7:
    for (lVar9 = (long)iVar7; lVar9 < (int)uVar14; lVar9 = lVar9 + 1) {
      uVar3 = uVar3 << 8 | (uint)*(byte *)((long)__src + lVar9);
      if (((*(byte *)((long)__src + lVar9) & 0x7c) == 0) && ((uVar3 & 0xffff80) == 0x80)) {
        uVar13 = (uint)lVar9 - 2;
        break;
      }
    }
    if ((RVar2 != 0) && ((uint)lVar9 == uVar14)) {
      mpp_packet_set_eos(dst);
      uVar13 = uVar14;
    }
    if (-1 < (int)uVar13) {
      uVar8 = (ulong)uVar13;
      memcpy((void *)((long)pvVar4 + sVar5),__src,uVar8);
      mpp_packet_set_length(dst,sVar5 + uVar8);
      mpp_packet_set_pos(src,(void *)((long)__src + uVar8));
      sVar5 = mpp_packet_get_length(src);
      if (uVar14 - uVar13 != (int)sVar5) {
        _mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,
                   "(RK_S32)mpp_packet_get_length(src) == (src_len - pos_frm_end)",
                   "mpp_h263_parser_split",0x180);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0018391e:
          abort();
        }
      }
      mpp_packet_set_length(src,(long)(int)(uVar14 - uVar13));
      MVar11 = MPP_OK;
      uVar13 = 0xffffffff;
      uVar12 = uVar13;
      goto LAB_001838da;
    }
  }
  __n = (size_t)(int)uVar14;
  memcpy((void *)((long)pvVar4 + sVar5),__src,__n);
  mpp_packet_set_length(dst,sVar5 + __n);
  mpp_packet_set_pos(src,(void *)((long)__src + __n));
  MVar11 = MPP_NOK;
LAB_001838da:
  *(uint *)((long)ctx + 0x28) = uVar12;
  *(uint *)((long)ctx + 0x2c) = uVar13;
  if (((byte)h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"out\n","mpp_h263_parser_split");
  }
  return MVar11;
}

Assistant:

MPP_RET mpp_h263_parser_split(H263dParser ctx, MppPacket dst, MppPacket src)
{
    MPP_RET ret = MPP_NOK;
    H263dParserImpl *p = (H263dParserImpl *)ctx;
    RK_U8 *dst_buf = mpp_packet_get_data(dst);
    size_t dst_len = mpp_packet_get_length(dst);
    RK_U8 *src_buf = mpp_packet_get_pos(src);
    RK_S32 src_len = (RK_S32)mpp_packet_get_length(src);
    RK_S32 pos_frm_start = p->pos_frm_start;
    RK_S32 pos_frm_end   = p->pos_frm_end;
    RK_U32 src_eos = mpp_packet_get_eos(src);
    RK_S32 src_pos = 0;
    RK_U32 state = (RK_U32) - 1;

    h263d_dbg_func("in\n");

    mpp_assert(src_len);

    if (dst_len) {
        mpp_assert(dst_len >= 4);
        state = ((RK_U32)(dst_buf[dst_len - 1]) <<  0) |
                ((RK_U32)(dst_buf[dst_len - 2]) <<  8) |
                ((RK_U32)(dst_buf[dst_len - 3]) << 16) |
                ((RK_U32)(dst_buf[dst_len - 4]) << 24);
    }

    if (pos_frm_start < 0) {
        // scan for frame start
        for (src_pos = 0; src_pos < src_len; src_pos++) {
            state = (state << 8) | src_buf[src_pos];
            if ((state & H263_STARTCODE_MASK) == H263_STARTCODE &&
                (state & H263_GOB_ZERO_MASK)  == H263_GOB_ZERO) {
                pos_frm_start = src_pos - 2;
                src_pos++;
                break;
            }
        }
    }

    if (pos_frm_start >= 0) {
        // scan for frame end
        for (; src_pos < src_len; src_pos++) {
            state = (state << 8) | src_buf[src_pos];

            if ((state & H263_STARTCODE_MASK) == H263_STARTCODE &&
                (state & H263_GOB_ZERO_MASK)  == H263_GOB_ZERO) {
                pos_frm_end = src_pos - 2;
                break;
            }
        }
        if (src_eos && src_pos == src_len) {
            pos_frm_end = src_len;
            mpp_packet_set_eos(dst);
        }
    }

    //mpp_log("pkt pos: start %d end %d len: left %d in %d\n",
    //        pos_frm_start, pos_frm_end, dst_len, src_len);

    if (pos_frm_start < 0 || pos_frm_end < 0) {
        // do not found frame start or do not found frame end, just copy the hold buffer to dst
        memcpy(dst_buf + dst_len, src_buf, src_len);
        // update dst buffer length
        mpp_packet_set_length(dst, dst_len + src_len);
        // set src buffer pos to end to src buffer
        mpp_packet_set_pos(src, src_buf + src_len);
    } else {
        // found both frame start and frame end - only copy frame
        memcpy(dst_buf + dst_len, src_buf, pos_frm_end);
        mpp_packet_set_length(dst, dst_len + pos_frm_end);

        // set src buffer pos to end to src buffer
        mpp_packet_set_pos(src, src_buf + pos_frm_end);
        mpp_assert((RK_S32)mpp_packet_get_length(src) == (src_len - pos_frm_end));
        mpp_packet_set_length(src, src_len - pos_frm_end);

        // return ok indicate the frame is ready and reset frame start/end position
        ret = MPP_OK;
        pos_frm_start = -1;
        pos_frm_end = -1;
    }

    p->pos_frm_start = pos_frm_start;
    p->pos_frm_end   = pos_frm_end;

    h263d_dbg_func("out\n");

    return ret;
}